

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeKRMmatricesGlobal
          (ChElementBeamIGA *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  DstEvaluatorType *pDVar1;
  ChMatrix33<double> *pCVar2;
  double *pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  element_type *peVar11;
  element_type *peVar12;
  PointerType pdVar13;
  ChIntegrable *pCVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  Index *pIVar25;
  ChElementBeamIGA *pCVar26;
  int iVar27;
  uint uVar28;
  SrcEvaluatorType srcEvaluator;
  element_type *peVar29;
  element_type *peVar30;
  ChQuadratureTables *pCVar31;
  pointer psVar32;
  undefined8 *puVar33;
  Index index;
  SrcEvaluatorType *pSVar34;
  ChStateDelta *pCVar35;
  double **ppdVar36;
  pointer psVar37;
  char *pcVar38;
  double *pdVar39;
  long lVar40;
  ulong uVar41;
  undefined1 *puVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  double dVar46;
  ActualDstType actualDst_1;
  long lVar47;
  long lVar48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var49;
  DenseStorage<double,__1,__1,__1,_1> *pDVar50;
  ulong uVar51;
  char cVar52;
  ChStateDelta *pCVar53;
  Index dstRows;
  long lVar54;
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ChMatrixDynamic<> K;
  ChVectorDynamic<> Q1;
  ActualDstType actualDst;
  ChState state_x_inc;
  ChVectorDynamic<> Jcolumn;
  ChVectorDynamic<> Q0;
  ChStateDelta state_delta;
  SrcEvaluatorType srcEvaluator_2;
  ChStateDelta state_w;
  DstEvaluatorType dstEvaluator;
  ChState state_x;
  SrcEvaluatorType srcEvaluator_1;
  ChMatrixNM<double,_6,_6> matr_loc;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_500;
  ChStateDelta *local_4e0;
  ChElementBeamIGA *local_4d8;
  DenseStorage<double,__1,__1,__1,_1> *local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4b1 [17];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_4a0;
  ChMatrixRef *local_488;
  DenseStorage<double,__1,__1,__1,_1> local_480;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_460;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_450;
  double local_440;
  ulong local_438;
  ChStateDelta local_430;
  ChMatrix33<double> local_418;
  undefined8 local_3c8;
  DenseStorage<double,__1,__1,__1,_1> *local_3c0;
  DenseStorage<double,__1,__1,__1,_1> *pDStack_3b8;
  DenseStorage<double,__1,__1,__1,_1> *pDStack_3b0;
  DenseStorage<double,__1,__1,__1,_1> *pDStack_3a8;
  double local_3a0;
  ChStateDelta local_398;
  undefined1 local_380 [96];
  DenseStorage<double,__1,__1,__1,_1> *local_320;
  DenseStorage<double,__1,__1,__1,_1> *pDStack_318;
  DenseStorage<double,__1,__1,__1,_1> *apDStack_310 [2];
  undefined1 local_300 [16];
  variable_if_dynamic<long,__1> vStack_2f0;
  XprTypeNested pMStack_2e8;
  variable_if_dynamic<long,__1> vStack_2e0;
  variable_if_dynamic<long,__1> vStack_2d8;
  undefined1 *puStack_2d0;
  plainobjectbase_evaluator_data<double,_3> pStack_2c8;
  DenseStorage<double,__1,__1,__1,_1> *local_2c0;
  double dStack_2b8;
  double dStack_2b0;
  double dStack_2a8;
  double dStack_2a0;
  double dStack_298;
  double dStack_290;
  double dStack_288;
  double local_280;
  double dStack_278;
  double dStack_270;
  double dStack_268;
  double dStack_260;
  double dStack_258;
  double dStack_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  double dStack_230;
  double dStack_228;
  double dStack_220;
  double dStack_218;
  double dStack_210;
  double dStack_208;
  double dStack_200;
  double dStack_1f8;
  double dStack_1f0;
  double dStack_1e8;
  ChVectorDynamic<> *local_1c0;
  double local_1b8;
  double local_1b0 [2];
  undefined1 local_1a0 [32];
  variable_if_dynamic<long,__1> local_180;
  variable_if_dynamic<long,__1> vStack_178;
  ChIntegrable *pCStack_170;
  double dStack_168;
  double local_160;
  double dStack_158;
  double dStack_150;
  double dStack_148;
  double local_140;
  double dStack_138;
  double dStack_130;
  double dStack_128;
  double local_120;
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  double local_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  double local_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  double local_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  
  auVar63._8_56_ = in_register_00001288;
  auVar63._0_8_ = Mfactor;
  lVar44 = (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value;
  local_440 = Mfactor;
  local_3c0 = (DenseStorage<double,__1,__1,__1,_1> *)Kfactor;
  local_320 = (DenseStorage<double,__1,__1,__1,_1> *)Rfactor;
  if ((lVar44 != ((long)(this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 3) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != lVar44)) {
    __assert_fail("(H.rows() == 6 * nodes.size()) && (H.cols() == 6 * nodes.size())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamIGA.cpp"
                  ,0xd3,
                  "virtual void chrono::fea::ChElementBeamIGA::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  if ((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamIGA.cpp"
                  ,0xd4,
                  "virtual void chrono::fea::ChElementBeamIGA::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  iVar27 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1e])(this);
  ChState::ChState((ChState *)(local_380 + 0x48),(long)iVar27,(ChIntegrable *)0x0);
  iVar27 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1f])(this);
  ChStateDelta::ChStateDelta(&local_398,(long)iVar27,(ChIntegrable *)0x0);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x20]
  )(this,0,local_380 + 0x48);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x21]
  )(this,0,&local_398);
  uVar28 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1f])(this);
  iVar27 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1e])(this);
  pCVar53 = (ChStateDelta *)(long)(int)uVar28;
  local_450.m_storage.m_data = (double *)0x0;
  local_450.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_450,(Index)pCVar53)
  ;
  ComputeInternalForces_impl
            (this,(ChVectorDynamic<> *)&local_450,(ChState *)(local_380 + 0x48),&local_398,true);
  local_4a0.m_storage.m_data = (double *)0x0;
  local_4a0.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_4a0,(Index)pCVar53)
  ;
  local_460.m_storage.m_data = (double *)0x0;
  local_460.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_460,(Index)pCVar53)
  ;
  local_438 = CONCAT44(local_438._4_4_,uVar28);
  local_4e0 = pCVar53;
  local_4d8 = this;
  local_488 = H;
  if (((double)local_3c0 != 0.0) || (NAN((double)local_3c0))) {
    local_500.m_functor = (assign_op<double,_double> *)0x0;
    local_500._0_16_ = ZEXT816(0);
    if ((int)uVar28 < 0) goto LAB_00689fca;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&local_500,(long)pCVar53 * (long)pCVar53,
               (Index)pCVar53,(Index)pCVar53);
    ChState::ChState((ChState *)&local_480,(long)iVar27,(ChIntegrable *)0x0);
    ChStateDelta::ChStateDelta(&local_430,(Index)pCVar53,(ChIntegrable *)0x0);
    ChStateDelta::setZero(&local_430,(Index)pCVar53,(ChIntegrable *)0x0);
    auVar62 = auVar63._0_16_;
    if (uVar28 == 0) {
      pCVar35 = (ChStateDelta *)local_500.m_src;
    }
    else {
      lVar44 = 0;
      pDVar50 = (DenseStorage<double,__1,__1,__1,_1> *)0x0;
      local_4d0 = (DenseStorage<double,__1,__1,__1,_1> *)(ulong)uVar28;
      do {
        if (local_430.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)pDVar50) goto LAB_00689e54;
        local_430.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [(long)pDVar50] =
             Delta + local_430.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [(long)pDVar50];
        auVar63 = ZEXT1664(auVar63._0_16_);
        (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
          [0x22])(this,0,&local_480,local_380 + 0x48,0,&local_430);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_4a0,(Index)pCVar53);
        if (local_4a0.m_storage.m_rows < 0) goto LAB_00689eac;
        if ((ChStateDelta *)local_4a0.m_storage.m_rows != (ChStateDelta *)0x0) {
          memset(local_4a0.m_storage.m_data,0,local_4a0.m_storage.m_rows << 3);
        }
        ComputeInternalForces_impl
                  (this,(ChVectorDynamic<> *)&local_4a0,(ChState *)&local_480,&local_398,true);
        pdVar3 = local_450.m_storage.m_data;
        pCVar35 = (ChStateDelta *)local_4a0.m_storage.m_rows;
        pdVar39 = local_4a0.m_storage.m_data;
        if (local_430.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)pDVar50) goto LAB_00689e54;
        local_430.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [(long)pDVar50] =
             local_430.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
             [(long)pDVar50] - Delta;
        if (local_4a0.m_storage.m_rows != local_450.m_storage.m_rows) goto LAB_00689ec3;
        if (local_4a0.m_storage.m_rows < 0) goto LAB_00689ee2;
        local_4b1._1_8_ = -1.0 / Delta;
        local_4b1._9_8_ = 0;
        if ((local_460.m_storage.m_rows != local_4a0.m_storage.m_rows) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_460,local_4a0.m_storage.m_rows,1),
           (ChStateDelta *)local_460.m_storage.m_rows != pCVar35)) goto LAB_00689f6a;
        auVar62 = auVar63._0_16_;
        pCVar53 = (ChStateDelta *)((ulong)pCVar35 & 0x7ffffffffffffff8);
        if ((ChStateDelta *)&DAT_00000007 < pCVar35) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_4b1._1_8_;
          auVar55 = vbroadcastsd_avx512f(auVar5);
          uVar45 = 0;
          do {
            auVar56 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar39 + uVar45),
                                     *(undefined1 (*) [64])(pdVar3 + uVar45));
            auVar56 = vmulpd_avx512f(auVar55,auVar56);
            *(undefined1 (*) [64])(local_460.m_storage.m_data + uVar45) = auVar56;
            uVar45 = uVar45 + 8;
          } while (uVar45 < pCVar53);
        }
        if ((long)pCVar53 < (long)pCVar35) {
          do {
            local_460.m_storage.m_data[(long)pCVar53] =
                 (double)local_4b1._1_8_ * (pdVar39[(long)pCVar53] - pdVar3[(long)pCVar53]);
            pCVar53 = (ChStateDelta *)
                      ((long)&(pCVar53->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
          } while (pCVar35 != pCVar53);
        }
        if ((long)local_500.m_src < 0 && local_500.m_dst != (DstEvaluatorType *)0x0)
        goto LAB_00689f04;
        if ((long)local_500.m_functor <= (long)pDVar50) goto LAB_00689f26;
        if ((ChStateDelta *)local_500.m_src != pCVar35) goto LAB_00689f48;
        if (pCVar35 != (ChStateDelta *)0x0) {
          pdVar39 = (double *)
                    ((long)&((local_500.m_dst)->
                            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                            ).m_d.data + lVar44);
          pCVar53 = (ChStateDelta *)0x0;
          do {
            pdVar3 = local_460.m_storage.m_data + (long)pCVar53;
            pCVar53 = (ChStateDelta *)
                      ((long)&(pCVar53->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
            *pdVar39 = *pdVar3;
            pdVar39 = pdVar39 + (long)local_500.m_functor;
          } while (pCVar35 != pCVar53);
        }
        pDVar50 = (DenseStorage<double,__1,__1,__1,_1> *)((long)&pDVar50->m_data + 1);
        lVar44 = lVar44 + 8;
        this = local_4d8;
        pCVar53 = local_4e0;
      } while (pDVar50 != local_4d0);
    }
    H = local_488;
    if ((long)((ulong)local_500.m_functor | (ulong)pCVar35) < 0) {
LAB_00689fec:
      pcVar38 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_00689ef7;
    }
    local_1a0._0_8_ =
         (local_488->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    pCStack_170 = (ChIntegrable *)
                  (local_488->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).m_stride.m_outer.m_value;
    local_1a0._24_8_ = local_488;
    local_180.m_value = 0;
    vStack_178.m_value = 0;
    local_1a0._8_8_ = pCVar53;
    local_1a0._16_8_ = pCVar53;
    if (((local_488->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_rows.m_value < (long)pCVar53) ||
       ((local_488->
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value < (long)pCVar53)) goto LAB_00689f89;
    local_300._8_8_ = local_3c0;
    pMStack_2e8 = (XprTypeNested)local_500.m_dst;
    vStack_2e0.m_value = (long)local_500.m_functor;
    if ((pCVar35 != pCVar53) || ((ChStateDelta *)local_500.m_functor != pCVar53)) {
      pcVar38 = 
      "void Eigen::DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>]"
      ;
      goto LAB_00689f5d;
    }
    local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)local_380;
    local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)local_300;
    local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)local_4b1;
    local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)local_1a0;
    auVar63 = ZEXT1664(auVar62);
    local_380._0_8_ = local_1a0._0_8_;
    local_380._16_8_ = pCStack_170;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_418);
    if (local_430.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      free((void *)local_430.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [-1]);
    }
    if ((XprTypeNested)local_480.m_data != (XprTypeNested)0x0) {
      free((void *)(((XprTypeNested)((long)local_480.m_data + -0x120))->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                   array[0x23]);
    }
    if (local_500.m_dst != (DstEvaluatorType *)0x0) {
      free(local_500.m_dst[-1].
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.data)
      ;
    }
    auVar62 = auVar63._0_16_;
    if (((double)local_320 != 0.0) || (NAN((double)local_320))) goto LAB_006885ee;
    if (((double)local_3c0 != 0.0) || (NAN((double)local_3c0))) {
      peVar30 = (this->section).
                super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      peVar29 = (peVar30->inertia).
                super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      p_Var49 = (peVar30->inertia).
                super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var49 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar10 = false;
        goto LAB_00688af4;
      }
      if (peVar29->compute_inertia_stiffness_matrix != false) goto LAB_00688b48;
    }
LAB_0068924f:
    if ((local_440 == 0.0) && (!NAN(local_440))) {
LAB_00689d97:
      if (local_460.m_storage.m_data != (double *)0x0) {
        free((void *)local_460.m_storage.m_data[-1]);
      }
      if (local_4a0.m_storage.m_data != (double *)0x0) {
        free((void *)local_4a0.m_storage.m_data[-1]);
      }
      if (local_450.m_storage.m_data != (double *)0x0) {
        free((void *)local_450.m_storage.m_data[-1]);
      }
      if (local_398.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_398.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if ((double)local_380._72_8_ != 0.0) {
        free(*(void **)(local_380._72_8_ + -8));
      }
      return;
    }
    psVar32 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar37 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_500.m_functor = (assign_op<double,_double> *)0x0;
    local_500._0_16_ = ZEXT816(0);
    lVar44 = (long)psVar32 - (long)psVar37;
    if (lVar44 < 0) {
LAB_00689fca:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    uVar45 = (lVar44 >> 3) * 3;
    if ((psVar32 != psVar37) &&
       (auVar16._8_8_ = 0, auVar16._0_8_ = uVar45,
       auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar5 / auVar16,0) < uVar45)) {
      puVar33 = (undefined8 *)__cxa_allocate_exception(8,0,SUB168(auVar5 % auVar16,0));
      *puVar33 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar33,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&local_500,uVar45 * uVar45,uVar45,uVar45);
    local_1a0._0_8_ = local_500.m_src;
    local_1a0._8_8_ = local_500.m_functor;
    local_1a0._16_8_ = (ChStateDelta *)0x0;
    if (-1 < (long)((ulong)local_500.m_functor | (ulong)local_500.m_src)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Matrix<double,__1,__1,_1,__1,__1> *)&local_500,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                  *)local_1a0,(assign_op<double,_double> *)local_300);
      if (lumped_mass == '\x01') {
        peVar30 = (this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        peVar29 = (peVar30->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var49 = (peVar30->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var49 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
          }
        }
        (*peVar29->_vptr_ChInertiaCosserat[2])(peVar29,local_1a0);
        if (p_Var49 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var49);
        }
        lVar44 = (long)(local_4d8->nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_4d8->nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        H = local_488;
        if (lVar44 != 0) {
          pCVar53 = (ChStateDelta *)0x18;
          lVar54 = 0;
          uVar45 = 0;
          auVar62 = vcvtusi2sd_avx512f(auVar62,lVar44 >> 4);
          local_4d0 = (DenseStorage<double,__1,__1,__1,_1> *)
                      (((local_4d8->super_ChElementBeam).length / auVar62._0_8_) * local_440);
          uStack_4c8 = 0;
          local_3c0 = local_4d0;
          pDStack_3b8 = local_4d0;
          do {
            lVar44 = uVar45 * 6 + 3;
            if (((long)local_500.m_src < lVar44) || ((long)local_500.m_functor < lVar44)) {
LAB_00689e32:
              pcVar38 = 
              "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
              ;
LAB_00689e47:
              __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,pcVar38);
            }
            ppdVar36 = (double **)
                       ((long)&local_500.m_dst[2].
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                               .m_d.data +
                       (long)((long)&(((ChVectorDynamic<double> *)&(local_500.m_functor)->field_0x0)
                                     ->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                                     .m_storage.m_data + 1) * lVar54);
            lVar40 = 0x10;
            do {
              dVar17 = *(double *)((long)local_1b0 + lVar40 + 8);
              ppdVar36[-2] = (double *)
                             ((double)local_3c0 * *(double *)((long)local_1b0 + lVar40) +
                             (double)ppdVar36[-2]);
              ppdVar36[-1] = (double *)((double)pDStack_3b8 * dVar17 + (double)ppdVar36[-1]);
              pdVar39 = (double *)(local_1a0 + lVar40);
              lVar40 = lVar40 + 0x30;
              *ppdVar36 = (double *)((double)local_4d0 * *pdVar39 + (double)*ppdVar36);
              ppdVar36 = ppdVar36 + (long)local_500.m_functor;
            } while (lVar40 != 0xa0);
            lVar40 = uVar45 * 6 + 6;
            if (((long)local_500.m_src < lVar40) || ((long)local_500.m_functor < lVar40))
            goto LAB_00689e32;
            ppdVar36 = (double **)
                       ((long)&local_500.m_dst[2].
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                               .m_d.data +
                       (long)((long)&(((ChVectorDynamic<double> *)&(local_500.m_functor)->field_0x0)
                                     ->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                                     .m_storage.m_data + 1) * (long)pCVar53);
            lVar47 = 0xb8;
            do {
              dVar17 = *(double *)((long)local_1b0 + lVar47 + 8);
              ppdVar36[-2] = (double *)
                             ((double)local_3c0 * *(double *)((long)local_1b0 + lVar47) +
                             (double)ppdVar36[-2]);
              ppdVar36[-1] = (double *)((double)pDStack_3b8 * dVar17 + (double)ppdVar36[-1]);
              pdVar39 = (double *)(local_1a0 + lVar47);
              lVar47 = lVar47 + 0x30;
              *ppdVar36 = (double *)((double)local_4d0 * *pdVar39 + (double)*ppdVar36);
              ppdVar36 = ppdVar36 + (long)local_500.m_functor;
            } while (lVar47 != 0x148);
            local_300._8_8_ = local_1a0 + 0x18;
            pMStack_2e8 = (XprTypeNested)local_1a0;
            local_300._0_8_ =
                 &((local_4d8->nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar45].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->field_0x58;
            vStack_2e0.m_value = 0;
            vStack_2d8.m_value = 3;
            puStack_2d0 = &DAT_00000006;
            local_4e0 = pCVar53;
            local_4b1._1_8_ = uVar45 * 6;
            local_2c0 = local_4d0;
            ChMatrix33<double>::operator=
                      (&local_418,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                        *)local_300);
            if (((long)local_500.m_src < lVar44) || ((long)local_500.m_functor < lVar40))
            goto LAB_00689e32;
            ppdVar36 = (double **)
                       ((long)&((local_500.m_dst)->
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                               ).m_d.data + (long)local_500.m_functor * lVar54);
            lVar47 = 0x10;
            do {
              dVar17 = *(double *)
                        ((long)local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + lVar47 + -8);
              dVar4 = ((double *)((long)(ppdVar36 + 3) + lVar54))[1];
              *(double *)((long)(ppdVar36 + 3) + lVar54) =
                   *(double *)
                    ((long)local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + lVar47 + -0x10) +
                   *(double *)((long)(ppdVar36 + 3) + lVar54);
              ((double *)((long)(ppdVar36 + 3) + lVar54))[1] = dVar17 + dVar4;
              pdVar39 = (double *)
                        ((long)local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + lVar47);
              lVar47 = lVar47 + 0x18;
              *(double *)((long)(ppdVar36 + 5) + lVar54) =
                   *pdVar39 + *(double *)((long)(ppdVar36 + 5) + lVar54);
              ppdVar36 = ppdVar36 + (long)local_500.m_functor;
            } while (lVar47 != 0x58);
            if (((long)local_500.m_src < lVar40) || ((long)local_500.m_functor < lVar44))
            goto LAB_00689e32;
            pCVar2 = (ChMatrix33<double> *)
                     (local_500.m_dst + local_4b1._1_8_ + lVar44 * (long)local_500.m_functor);
            if ((local_500.m_dst != (DstEvaluatorType *)0x0) && (&local_418 == pCVar2)) {
LAB_00689e76:
              __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                            ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                            "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>, MightHaveTransposeAliasing = true]"
                           );
            }
            uVar45 = uVar45 + 1;
            lVar54 = lVar54 + 0x30;
            (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
                 local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0] + (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0];
            (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
                 local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3] + (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1];
            (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
                 local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6] + (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[2];
            (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
            [(long)local_500.m_functor] =
                 local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] + (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)local_500.m_functor];
            (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
            [(long)((long)&(((ChVectorDynamic<double> *)&(local_500.m_functor)->field_0x0)->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                           .m_data + 1)] =
                 local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4] + (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)((long)&(((ChVectorDynamic<double> *)
                                             &(local_500.m_functor)->field_0x0)->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_data + 1)];
            (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
            [(long)((long)&(((ChVectorDynamic<double> *)&(local_500.m_functor)->field_0x0)->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                           .m_data + 2)] =
                 local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7] + (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)((long)&(((ChVectorDynamic<double> *)
                                             &(local_500.m_functor)->field_0x0)->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_data + 2)];
            (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
            [(long)local_500.m_functor * 2] =
                 local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2] + (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)local_500.m_functor * 2];
            (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
            [(long)local_500.m_functor * 2 + 1] =
                 local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5] + (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)local_500.m_functor * 2 + 1];
            (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
            [(long)local_500.m_functor * 2 + 2] =
                 local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8] + (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)local_500.m_functor * 2 + 2];
            pCVar53 = local_4e0 + 2;
            H = local_488;
          } while (uVar45 < (ulong)((long)(local_4d8->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_4d8->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
      }
      else {
        peVar30 = (this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        peVar29 = (peVar30->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var49 = (peVar30->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var49 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
          }
        }
        (*peVar29->_vptr_ChInertiaCosserat[2])(peVar29,local_1a0);
        if (p_Var49 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var49);
        }
        lVar44 = (long)this->order;
        if ((lVar44 < 0) ||
           (uVar45 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows, (long)uVar45 <= lVar44)) {
LAB_00689e54:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        uVar41 = (ulong)~this->order;
        lVar54 = uVar45 + uVar41;
        if ((lVar54 < 0) || (!CARRY8(uVar45,uVar41))) goto LAB_00689e54;
        if (0 < this->int_order_b) {
          pdVar39 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          local_1c0 = &this->knots;
          dVar46 = 0.0;
          dVar17 = pdVar39[lVar44];
          dVar4 = pdVar39[lVar54];
          local_3a0 = (dVar4 - dVar17) * 0.5;
          local_1b8 = (dVar17 + dVar4) * 0.5;
          do {
            pCVar31 = ChQuadrature::GetStaticTables();
            auVar59._8_8_ = 0;
            auVar59._0_8_ = local_1b8;
            auVar61._8_8_ = 0;
            auVar61._0_8_ =
                 *(ulong *)(*(long *)&(pCVar31->Lroots).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(long)this->int_order_b + -1].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + (long)dVar46 * 8);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = local_3a0;
            auVar62 = vfmadd132sd_fma(auVar61,auVar59,auVar9);
            local_4b1._1_8_ = auVar62._0_8_;
            pCVar31 = ChQuadrature::GetStaticTables();
            iVar27 = this->order;
            local_4e0 = *(ChStateDelta **)
                         (*(long *)&(pCVar31->Weight).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(long)this->int_order_b + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         (long)dVar46 * 8);
            local_4d0 = (DenseStorage<double,__1,__1,__1,_1> *)
                        (this->Jacobian_b).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)dVar46];
            local_380._0_8_ = (SrcEvaluatorType *)0x0;
            local_380._8_8_ = 0.0;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_380,
                       (long)(int)((ulong)((long)(this->nodes).
                                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
            local_1b0[0] = dVar46;
            geometry::ChBasisToolsBspline::BasisEvaluate
                      (this->order,iVar27,(double)local_4b1._1_8_,local_1c0,
                       (ChVectorDynamic<> *)local_380);
            psVar32 = (this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            psVar37 = (this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (psVar37 != psVar32) {
              uVar45 = 0;
              uVar41 = 0;
              dVar17 = (double)local_4e0 * local_440 * (double)local_4d0;
              local_4d0 = (DenseStorage<double,__1,__1,__1,_1> *)0x18;
              local_1b0[1] = dVar17 * local_3a0;
              do {
                if (psVar37 == psVar32) break;
                pCVar53 = (ChStateDelta *)0x10;
                lVar44 = 0x28;
                uVar51 = 0;
                local_3c0 = (DenseStorage<double,__1,__1,__1,_1> *)(uVar41 * 6 + 3);
                local_320 = (DenseStorage<double,__1,__1,__1,_1> *)(uVar41 * 6 + 6);
                local_438 = uVar45;
                do {
                  if (((long)local_380._8_8_ <= (long)uVar41) ||
                     ((long)local_380._8_8_ <= (long)uVar51)) goto LAB_00689e54;
                  if ((long)local_500.m_src < (long)local_3c0) goto LAB_00689e32;
                  dVar17 = (double)(uVar51 * 6 + 3);
                  if ((long)local_500.m_functor < (long)dVar17) goto LAB_00689e32;
                  lVar40 = 0x10;
                  puVar42 = (undefined1 *)
                            ((long)&((local_500.m_dst)->
                                    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                    ).m_d.data + (long)pCVar53);
                  lVar54 = local_438 * (long)local_500.m_functor;
                  pDVar50 = (DenseStorage<double,__1,__1,__1,_1> *)
                            ((double)(&((product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                         *)local_380._0_8_)->m_lhs)[uVar41] *
                             (double)(&((product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                         *)local_380._0_8_)->m_lhs)[uVar51] * local_1b0[1]);
                  do {
                    dVar4 = *(double *)((long)local_1b0 + lVar40 + 8);
                    dVar46 = *(double *)((long)(puVar42 + lVar54 + -0x10) + 8);
                    *(double *)(puVar42 + lVar54 + -0x10) =
                         (double)pDVar50 * *(double *)((long)local_1b0 + lVar40) +
                         *(double *)(puVar42 + lVar54 + -0x10);
                    *(double *)((long)(puVar42 + lVar54 + -0x10) + 8) =
                         (double)pDVar50 * dVar4 + dVar46;
                    pdVar39 = (double *)(local_1a0 + lVar40);
                    lVar40 = lVar40 + 0x30;
                    *(double *)(puVar42 + lVar54) =
                         (double)pDVar50 * *pdVar39 + *(double *)(puVar42 + lVar54);
                    puVar42 = puVar42 + (long)local_500.m_functor * 8;
                  } while (lVar40 != 0xa0);
                  if (((long)local_500.m_src < (long)local_320) ||
                     (lVar54 = uVar51 * 6 + 6, (long)local_500.m_functor < lVar54))
                  goto LAB_00689e32;
                  lVar48 = 0xb8;
                  lVar40 = (long)local_4d0 * (long)local_500.m_functor;
                  lVar47 = (long)&((local_500.m_dst)->
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  ).m_d.data + lVar44;
                  do {
                    dVar4 = *(double *)((long)local_1b0 + lVar48 + 8);
                    pdVar39 = (double *)(lVar47 + -0x10 + lVar40);
                    dVar46 = pdVar39[1];
                    pdVar3 = (double *)(lVar47 + -0x10 + lVar40);
                    *pdVar3 = (double)pDVar50 * *(double *)((long)local_1b0 + lVar48) + *pdVar39;
                    pdVar3[1] = (double)pDVar50 * dVar4 + dVar46;
                    pdVar39 = (double *)(local_1a0 + lVar48);
                    lVar48 = lVar48 + 0x30;
                    *(double *)(lVar47 + lVar40) =
                         (double)pDVar50 * *pdVar39 + *(double *)(lVar47 + lVar40);
                    lVar47 = lVar47 + (long)local_500.m_functor * 8;
                  } while (lVar48 != 0x148);
                  local_300._8_8_ = local_1a0 + 0x18;
                  pMStack_2e8 = (XprTypeNested)local_1a0;
                  local_300._0_8_ =
                       &((local_4d8->nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar41].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
                  vStack_2e0.m_value = 0;
                  vStack_2d8.m_value = 3;
                  puStack_2d0 = &DAT_00000006;
                  local_4e0 = pCVar53;
                  local_4b1._1_8_ = dVar17;
                  local_2c0 = pDVar50;
                  ChMatrix33<double>::operator=
                            (&local_418,
                             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                              *)local_300);
                  if (((long)local_500.m_src < (long)local_3c0) ||
                     ((long)local_500.m_functor < lVar54)) goto LAB_00689e32;
                  lVar47 = 0x10;
                  lVar54 = local_438 * (long)local_500.m_functor;
                  lVar40 = (long)&((local_500.m_dst)->
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  ).m_d.data + lVar44;
                  do {
                    dVar17 = *(double *)
                              ((long)local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array + lVar47 + -8);
                    pdVar39 = (double *)(lVar40 + -0x10 + lVar54);
                    dVar4 = pdVar39[1];
                    pdVar3 = (double *)(lVar40 + -0x10 + lVar54);
                    *pdVar3 = *(double *)
                               ((long)local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data.array + lVar47 + -0x10) + *pdVar39;
                    pdVar3[1] = dVar17 + dVar4;
                    pdVar39 = (double *)
                              ((long)local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array + lVar47);
                    lVar47 = lVar47 + 0x18;
                    *(double *)(lVar40 + lVar54) = *pdVar39 + *(double *)(lVar40 + lVar54);
                    lVar40 = lVar40 + (long)local_500.m_functor * 8;
                  } while (lVar47 != 0x58);
                  if (((long)local_500.m_src < (long)local_320) ||
                     ((long)local_500.m_functor < (long)local_4b1._1_8_)) goto LAB_00689e32;
                  pCVar2 = (ChMatrix33<double> *)
                           (local_500.m_dst +
                           uVar51 * 6 + (long)local_500.m_functor * (long)local_3c0);
                  if ((local_500.m_dst != (DstEvaluatorType *)0x0) && (&local_418 == pCVar2))
                  goto LAB_00689e76;
                  uVar51 = uVar51 + 1;
                  lVar44 = lVar44 + 0x30;
                  pCVar53 = local_4e0 + 2;
                  (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0] = local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[0] +
                             (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[0];
                  (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] = local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[3] +
                             (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[1];
                  (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[2] = local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[6] +
                             (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[2];
                  (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[(long)local_500.m_functor] =
                       local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1] +
                       (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)local_500.m_functor];
                  (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[(long)((long)&(((ChVectorDynamic<double> *)&(local_500.m_functor)->field_0x0
                                       )->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      ).m_storage.m_data + 1)] =
                       local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[4] +
                       (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)((long)&(((ChVectorDynamic<double> *)
                                             &(local_500.m_functor)->field_0x0)->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_data + 1)];
                  (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[(long)((long)&(((ChVectorDynamic<double> *)&(local_500.m_functor)->field_0x0
                                       )->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      ).m_storage.m_data + 2)] =
                       local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[7] +
                       (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)((long)&(((ChVectorDynamic<double> *)
                                             &(local_500.m_functor)->field_0x0)->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_data + 2)];
                  (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[(long)local_500.m_functor * 2] =
                       local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[2] +
                       (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)local_500.m_functor * 2];
                  (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[(long)local_500.m_functor * 2 + 1] =
                       local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
                       (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)local_500.m_functor * 2 + 1];
                  (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[(long)local_500.m_functor * 2 + 2] =
                       local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8] +
                       (pCVar2->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[(long)local_500.m_functor * 2 + 2];
                  psVar37 = (local_4d8->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  psVar32 = (local_4d8->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar43 = (long)psVar37 - (long)psVar32 >> 4;
                } while (uVar51 < uVar43);
                local_4d0 = local_4d0 + 2;
                uVar41 = uVar41 + 1;
                uVar45 = local_438 + 0x30;
                this = local_4d8;
              } while (uVar41 < uVar43);
            }
            if ((SrcEvaluatorType *)local_380._0_8_ != (SrcEvaluatorType *)0x0) {
              free((void *)(((SrcEvaluatorType *)(local_380._0_8_ + -0x58))->
                           super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           ).m_innerDim);
            }
            dVar46 = (double)((long)local_1b0[0] + 1);
            H = local_488;
          } while ((long)dVar46 < (long)this->int_order_b);
        }
      }
      local_1a0._0_8_ =
           (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      pCVar14 = (ChIntegrable *)
                (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).m_stride.m_outer.m_value;
      local_1a0._8_8_ = local_500.m_src;
      local_1a0._16_8_ = local_500.m_functor;
      if ((long)((ulong)local_500.m_functor | (ulong)local_500.m_src) < 0 &&
          (SrcEvaluatorType *)local_1a0._0_8_ != (SrcEvaluatorType *)0x0) {
        pcVar38 = 
        "Eigen::MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, Level = 0]"
        ;
LAB_00689f19:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar38);
      }
      local_180.m_value = 0;
      vStack_178.m_value = 0;
      local_1a0._24_8_ = H;
      pCStack_170 = pCVar14;
      if (((((long)local_500.m_src < 0) || ((long)local_500.m_functor < 0)) ||
          ((H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < (long)local_500.m_src)) ||
         ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value < (long)local_500.m_functor)) {
LAB_00689f89:
        vStack_178.m_value = 0;
        local_180.m_value = 0;
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_300._8_8_ = &local_480;
      local_480.m_data = (double *)local_500.m_dst;
      local_300._0_8_ = local_380;
      local_480.m_rows = (Index)local_500.m_functor;
      vStack_2f0.m_value = (long)&local_430;
      pMStack_2e8 = (XprTypeNested)local_1a0;
      local_380._0_8_ = local_1a0._0_8_;
      local_380._16_8_ = pCVar14;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)local_300);
      if (local_500.m_dst != (DstEvaluatorType *)0x0) {
        free(local_500.m_dst[-1].
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
             data);
      }
      goto LAB_00689d97;
    }
  }
  else if (-1 < ((H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value |
                (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value)) {
    local_1a0._8_8_ = &local_418;
    local_1a0._0_8_ = local_300;
    local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_300._0_8_ =
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    vStack_2f0.m_value =
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    local_1a0._16_8_ = local_380;
    local_1a0._24_8_ = H;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_1a0);
    auVar62 = auVar63._0_16_;
    if (((double)local_320 == 0.0) && (!NAN((double)local_320))) goto LAB_0068924f;
LAB_006885ee:
    peVar30 = (this->section).
              super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    peVar11 = (peVar30->damping).
              super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var49 = (peVar30->damping).
              super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var49 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var49);
    }
    auVar62 = auVar63._0_16_;
    if (peVar11 != (element_type *)0x0) {
      ChStateDelta::ChStateDelta((ChStateDelta *)&local_500,(Index)pCVar53,(ChIntegrable *)0x0);
      pdVar39 = local_398.super_ChVectorDynamic<double>.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if (local_500.m_src !=
          (SrcEvaluatorType *)
          local_398.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_500,
                   local_398.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                  );
        if (local_500.m_src !=
            (SrcEvaluatorType *)
            local_398.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar38 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
          ;
LAB_00689f7f:
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar38);
        }
      }
      uVar45 = local_438;
      pSVar34 = (SrcEvaluatorType *)
                ((long)&((product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                          *)local_398.super_ChVectorDynamic<double>.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_rows)->m_lhs + 7);
      if (-1 < local_398.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pSVar34 = (SrcEvaluatorType *)
                  local_398.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      pSVar34 = (SrcEvaluatorType *)((ulong)pSVar34 & 0xfffffffffffffff8);
      if (7 < local_398.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar44 = 0;
        do {
          pdVar3 = pdVar39 + lVar44;
          pdVar18 = (double *)pdVar3[1];
          pdVar19 = (double *)pdVar3[2];
          pdVar20 = (double *)pdVar3[3];
          pdVar21 = (double *)pdVar3[4];
          pdVar22 = (double *)pdVar3[5];
          pdVar23 = (double *)pdVar3[6];
          pdVar24 = (double *)pdVar3[7];
          pDVar1 = local_500.m_dst + lVar44;
          (pDVar1->super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>).
          m_d.data = (double *)*pdVar3;
          pDVar1[1].super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
          m_d.data = pdVar18;
          pDVar1[2].super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
          m_d.data = pdVar19;
          pDVar1[3].super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
          m_d.data = pdVar20;
          pDVar1[4].super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
          m_d.data = pdVar21;
          pDVar1[5].super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
          m_d.data = pdVar22;
          pDVar1[6].super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
          m_d.data = pdVar23;
          pDVar1[7].super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
          m_d.data = pdVar24;
          lVar44 = lVar44 + 8;
        } while (lVar44 < (long)pSVar34);
      }
      if ((long)pSVar34 <
          local_398.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          local_500.m_dst[(long)pSVar34].
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.data =
               (double *)pdVar39[(long)pSVar34];
          pSVar34 = (SrcEvaluatorType *)
                    ((long)&(pSVar34->
                            super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                            ).m_lhs + 1);
        } while ((SrcEvaluatorType *)
                 local_398.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                 pSVar34);
      }
      iVar27 = (int)local_438;
      local_480.m_cols = 0;
      local_480.m_data = (double *)0x0;
      local_480.m_rows = 0;
      local_500.m_functor = (assign_op<double,_double> *)local_398.integrable;
      if ((int)local_438 < 0) goto LAB_00689fca;
      if (((int)local_438 != 0) &&
         (auVar15._8_8_ = 0, auVar15._0_8_ = pCVar53,
         SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar15,0) < pCVar53)) {
        puVar33 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar33 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar33,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      auVar63 = ZEXT1664(auVar62);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                (&local_480,(long)pCVar53 * (long)pCVar53,(Index)pCVar53,(Index)pCVar53);
      auVar62 = auVar63._0_16_;
      pCVar53 = (ChStateDelta *)local_480.m_rows;
      if (iVar27 != 0) {
        local_4d0 = (DenseStorage<double,__1,__1,__1,_1> *)(uVar45 & 0xffffffff);
        lVar44 = 0;
        pDVar50 = (DenseStorage<double,__1,__1,__1,_1> *)0x0;
        do {
          auVar63 = ZEXT1664(auVar63._0_16_);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_4a0,(Index)local_4e0);
          if (local_4a0.m_storage.m_rows < 0) goto LAB_00689eac;
          if ((ChStateDelta *)local_4a0.m_storage.m_rows != (ChStateDelta *)0x0) {
            memset(local_4a0.m_storage.m_data,0,local_4a0.m_storage.m_rows << 3);
          }
          if ((long)local_500.m_src <= (long)pDVar50) goto LAB_00689e54;
          local_500.m_dst[(long)pDVar50].
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.data =
               (double *)
               (Delta + (double)local_500.m_dst[(long)pDVar50].
                                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                .m_d.data);
          ComputeInternalForces_impl
                    (this,(ChVectorDynamic<> *)&local_4a0,(ChState *)(local_380 + 0x48),
                     (ChStateDelta *)&local_500,true);
          pdVar3 = local_450.m_storage.m_data;
          pCVar53 = (ChStateDelta *)local_4a0.m_storage.m_rows;
          pdVar39 = local_4a0.m_storage.m_data;
          if ((long)local_500.m_src <= (long)pDVar50) goto LAB_00689e54;
          local_500.m_dst[(long)pDVar50].
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.data =
               (double *)
               ((double)local_500.m_dst[(long)pDVar50].
                        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                        .m_d.data - Delta);
          if (local_4a0.m_storage.m_rows != local_450.m_storage.m_rows) {
LAB_00689ec3:
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                         );
          }
          if (local_4a0.m_storage.m_rows < 0) goto LAB_00689ee2;
          local_4b1._1_8_ = -1.0 / Delta;
          local_4b1._9_8_ = 0;
          if ((local_460.m_storage.m_rows != local_4a0.m_storage.m_rows) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_460,local_4a0.m_storage.m_rows,1),
             (ChStateDelta *)local_460.m_storage.m_rows != pCVar53)) goto LAB_00689f6a;
          auVar62 = auVar63._0_16_;
          pCVar35 = (ChStateDelta *)((ulong)pCVar53 & 0x7ffffffffffffff8);
          if ((ChStateDelta *)&DAT_00000007 < pCVar53) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_4b1._1_8_;
            auVar55 = vbroadcastsd_avx512f(auVar6);
            uVar45 = 0;
            do {
              auVar56 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar39 + uVar45),
                                       *(undefined1 (*) [64])(pdVar3 + uVar45));
              auVar56 = vmulpd_avx512f(auVar55,auVar56);
              *(undefined1 (*) [64])(local_460.m_storage.m_data + uVar45) = auVar56;
              uVar45 = uVar45 + 8;
            } while (uVar45 < pCVar35);
          }
          if ((long)pCVar35 < (long)pCVar53) {
            do {
              local_460.m_storage.m_data[(long)pCVar35] =
                   (double)local_4b1._1_8_ * (pdVar39[(long)pCVar35] - pdVar3[(long)pCVar35]);
              pCVar35 = (ChStateDelta *)
                        ((long)&(pCVar35->super_ChVectorDynamic<double>).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + 1);
            } while (pCVar53 != pCVar35);
          }
          if (local_480.m_rows < 0 && (XprTypeNested)local_480.m_data != (XprTypeNested)0x0)
          goto LAB_00689f04;
          if (local_480.m_cols <= (long)pDVar50) {
LAB_00689f26:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                          "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                         );
          }
          if ((ChStateDelta *)local_480.m_rows != pCVar53) goto LAB_00689f48;
          if (pCVar53 != (ChStateDelta *)0x0) {
            pdVar39 = (double *)
                      ((long)(((PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)
                              local_480.m_data)->m_storage).m_data.array + lVar44);
            pCVar35 = (ChStateDelta *)0x0;
            do {
              pdVar3 = local_460.m_storage.m_data + (long)pCVar35;
              pCVar35 = (ChStateDelta *)
                        ((long)&(pCVar35->super_ChVectorDynamic<double>).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + 1);
              *pdVar39 = *pdVar3;
              pdVar39 = pdVar39 + local_480.m_cols;
            } while (pCVar53 != pCVar35);
          }
          pDVar50 = (DenseStorage<double,__1,__1,__1,_1> *)((long)&pDVar50->m_data + 1);
          lVar44 = lVar44 + 8;
          this = local_4d8;
          H = local_488;
        } while (pDVar50 != local_4d0);
      }
      if ((long)(local_480.m_cols | (ulong)pCVar53) < 0) goto LAB_00689fec;
      local_1a0._0_8_ =
           (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      pCStack_170 = (ChIntegrable *)
                    (H->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    ).m_stride.m_outer.m_value;
      local_1a0._8_8_ = local_4e0;
      local_1a0._16_8_ = local_4e0;
      local_180.m_value = 0;
      vStack_178.m_value = 0;
      local_1a0._24_8_ = H;
      if (((H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < (long)local_4e0) ||
         (local_1a0._24_8_ = H,
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_cols.m_value < (long)local_4e0)) goto LAB_00689f89;
      local_300._8_8_ = local_320;
      pMStack_2e8 = (XprTypeNested)local_480.m_data;
      vStack_2e0.m_value = local_480.m_cols;
      local_1a0._24_8_ = H;
      if ((pCVar53 != local_4e0) || ((ChStateDelta *)local_480.m_cols != local_4e0)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_380;
      local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_300;
      local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)&local_430;
      local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           (double)local_1a0;
      auVar63 = ZEXT1664(auVar62);
      local_380._0_8_ = local_1a0._0_8_;
      local_380._16_8_ = pCStack_170;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)&local_418);
      if ((XprTypeNested)local_480.m_data != (XprTypeNested)0x0) {
        free((void *)(((XprTypeNested)((long)local_480.m_data + -0x120))->
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                     array[0x23]);
      }
      if (local_500.m_dst != (DstEvaluatorType *)0x0) {
        free(local_500.m_dst[-1].
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
             data);
      }
    }
    auVar62 = auVar63._0_16_;
    peVar30 = (this->section).
              super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    peVar29 = (peVar30->inertia).
              super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar35 = (ChStateDelta *)
              (peVar30->inertia).
              super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (pCVar35 == (ChStateDelta *)0x0) {
      if (peVar29->compute_inertia_damping_matrix == false) goto LAB_00688ac8;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        pIVar25 = &(pCVar35->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        *(int *)pIVar25 = (int)*pIVar25 + 1;
        UNLOCK();
      }
      else {
        pIVar25 = &(pCVar35->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        *(int *)pIVar25 = (int)*pIVar25 + 1;
      }
      if (peVar29->compute_inertia_damping_matrix == false) {
LAB_00688ac8:
        if (((double)local_3c0 == 0.0) && (!NAN((double)local_3c0))) {
          if (pCVar35 != (ChStateDelta *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar35);
          }
          goto LAB_0068924f;
        }
        peVar30 = (this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        bVar10 = true;
        peVar29 = (peVar30->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var49 = (peVar30->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var49 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          cVar52 = peVar29->compute_inertia_stiffness_matrix;
LAB_00688b32:
          if (pCVar35 != (ChStateDelta *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar35);
          }
        }
        else {
LAB_00688af4:
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
          }
          cVar52 = peVar29->compute_inertia_stiffness_matrix;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var49);
          if (bVar10) goto LAB_00688b32;
        }
        auVar62 = auVar63._0_16_;
        if (cVar52 == '\0') goto LAB_0068924f;
      }
      else {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar35);
      }
    }
LAB_00688b48:
    auVar62 = auVar63._0_16_;
    dStack_200 = 0.0;
    dStack_1f8 = 0.0;
    dStack_1f0 = 0.0;
    dStack_1e8 = 0.0;
    local_240 = 0.0;
    dStack_238 = 0.0;
    dStack_230 = 0.0;
    dStack_228 = 0.0;
    dStack_220 = 0.0;
    dStack_218 = 0.0;
    dStack_210 = 0.0;
    dStack_208 = 0.0;
    local_280 = 0.0;
    dStack_278 = 0.0;
    dStack_270 = 0.0;
    dStack_268 = 0.0;
    dStack_260 = 0.0;
    dStack_258 = 0.0;
    dStack_250 = 0.0;
    dStack_248 = 0.0;
    local_2c0 = (DenseStorage<double,__1,__1,__1,_1> *)0x0;
    dStack_2b8 = 0.0;
    dStack_2b0 = 0.0;
    dStack_2a8 = 0.0;
    dStack_2a0 = 0.0;
    dStack_298 = 0.0;
    dStack_290 = 0.0;
    dStack_288 = 0.0;
    local_300._0_8_ = (type)0x0;
    local_300._8_8_ = (DenseStorage<double,__1,__1,__1,_1> *)0x0;
    vStack_2f0.m_value = 0;
    pMStack_2e8 = (XprTypeNested)0x0;
    vStack_2e0.m_value = 0;
    vStack_2d8.m_value = 0;
    puStack_2d0 = (undefined1 *)0x0;
    pStack_2c8.data = (double *)0x0;
    if ((this->nodes).
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->nodes).
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar45 = 0;
      dVar17 = (this->super_ChElementBeam).length * 0.5;
      local_4b1._1_8_ = 1.18575755001899e-322;
      pDStack_318 = (DenseStorage<double,__1,__1,__1,_1> *)(dVar17 * (double)local_3c0);
      local_3c0 = (DenseStorage<double,__1,__1,__1,_1> *)(dVar17 * (double)local_320);
      pDStack_3b8 = local_3c0;
      pDStack_3b0 = local_3c0;
      pDStack_3a8 = local_3c0;
      local_320 = pDStack_318;
      apDStack_310[0] = pDStack_318;
      apDStack_310[1] = pDStack_318;
      do {
        auVar62 = auVar63._0_16_;
        peVar30 = (this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        peVar29 = (peVar30->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var49 = (peVar30->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var49 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (peVar29->compute_inertia_damping_matrix != false) {
LAB_00688c45:
            bVar10 = true;
            p_Var49 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            goto LAB_00688c56;
          }
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
          }
          bVar10 = peVar29->compute_inertia_damping_matrix;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var49);
          peVar30 = (this->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          if (bVar10 == true) {
            peVar29 = (peVar30->inertia).
                      super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            p_Var49 = (peVar30->inertia).
                      super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            if (p_Var49 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00688c45;
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
            }
            bVar10 = false;
LAB_00688c56:
            ChFrameMoving<double>::GetWvel_loc
                      ((ChFrameMoving<double> *)
                       &(((local_4d8->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar45].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_ChNodeFEAbase).field_0x18);
            (*peVar29->_vptr_ChInertiaCosserat[3])(peVar29,local_1a0,&local_418);
            H = local_488;
            if (!bVar10) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var49);
            }
            local_300._0_8_ =
                 (type)((double)local_3c0 * (double)local_1a0._0_8_ + (double)local_300._0_8_);
            local_300._8_8_ =
                 (DenseStorage<double,__1,__1,__1,_1> *)
                 ((double)pDStack_3b8 * (double)local_1a0._8_8_ + (double)local_300._8_8_);
            vStack_2f0.m_value =
                 (long)((double)pDStack_3b0 * (double)local_1a0._16_8_ + (double)vStack_2f0.m_value)
            ;
            pMStack_2e8 = (XprTypeNested)
                          ((double)pDStack_3a8 * (double)local_1a0._24_8_ + (double)pMStack_2e8);
            vStack_2e0.m_value =
                 (long)((double)local_3c0 * (double)local_180.m_value + (double)vStack_2e0.m_value);
            vStack_2d8.m_value =
                 (long)((double)pDStack_3b8 * (double)vStack_178.m_value +
                       (double)vStack_2d8.m_value);
            puStack_2d0 = (undefined1 *)
                          ((double)pDStack_3b0 * (double)pCStack_170 + (double)puStack_2d0);
            pStack_2c8.data = (double *)((double)pDStack_3a8 * dStack_168 + pStack_2c8.data);
            local_2c0 = (DenseStorage<double,__1,__1,__1,_1> *)
                        ((double)local_3c0 * local_160 + (double)local_2c0);
            dStack_2b8 = (double)pDStack_3b8 * dStack_158 + dStack_2b8;
            dStack_2b0 = (double)pDStack_3b0 * dStack_150 + dStack_2b0;
            dStack_2a8 = (double)pDStack_3a8 * dStack_148 + dStack_2a8;
            dStack_2a0 = (double)local_3c0 * local_140 + dStack_2a0;
            dStack_298 = (double)pDStack_3b8 * dStack_138 + dStack_298;
            dStack_290 = (double)pDStack_3b0 * dStack_130 + dStack_290;
            dStack_288 = (double)pDStack_3a8 * dStack_128 + dStack_288;
            local_280 = (double)local_3c0 * local_120 + local_280;
            dStack_278 = (double)pDStack_3b8 * dStack_118 + dStack_278;
            dStack_270 = (double)pDStack_3b0 * dStack_110 + dStack_270;
            dStack_268 = (double)pDStack_3a8 * dStack_108 + dStack_268;
            dStack_260 = (double)local_3c0 * local_100 + dStack_260;
            dStack_258 = (double)pDStack_3b8 * dStack_f8 + dStack_258;
            dStack_250 = (double)pDStack_3b0 * dStack_f0 + dStack_250;
            dStack_248 = (double)pDStack_3a8 * dStack_e8 + dStack_248;
            local_240 = (double)local_3c0 * local_e0 + local_240;
            dStack_238 = (double)pDStack_3b8 * dStack_d8 + dStack_238;
            dStack_230 = (double)pDStack_3b0 * dStack_d0 + dStack_230;
            dStack_228 = (double)pDStack_3a8 * dStack_c8 + dStack_228;
            dStack_220 = (double)local_3c0 * local_c0 + dStack_220;
            dStack_218 = (double)pDStack_3b8 * dStack_b8 + dStack_218;
            dStack_210 = (double)pDStack_3b0 * dStack_b0 + dStack_210;
            dStack_208 = (double)pDStack_3a8 * dStack_a8 + dStack_208;
            dStack_200 = (double)local_3c0 * local_a0 + dStack_200;
            dStack_1f8 = (double)pDStack_3b8 * dStack_98 + dStack_1f8;
            dStack_1f0 = (double)pDStack_3b0 * dStack_90 + dStack_1f0;
            dStack_1e8 = (double)pDStack_3a8 * dStack_88 + dStack_1e8;
            peVar30 = (local_4d8->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            this = local_4d8;
          }
        }
        peVar29 = (peVar30->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var49 = (peVar30->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var49 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (peVar29->compute_inertia_stiffness_matrix != false) {
LAB_00688e20:
            local_4d0 = (DenseStorage<double,__1,__1,__1,_1> *)0x0;
            local_4e0 = (ChStateDelta *)
                        CONCAT44(local_4e0._4_4_,(int)CONCAT71((int7)((ulong)peVar30 >> 8),1));
            goto LAB_00688e3d;
          }
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var49->_M_use_count = p_Var49->_M_use_count + 1;
          }
          bVar10 = peVar29->compute_inertia_stiffness_matrix;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var49);
          if (bVar10 == true) {
            peVar30 = (this->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            peVar29 = (peVar30->inertia).
                      super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            local_4d0 = (DenseStorage<double,__1,__1,__1,_1> *)
                        (peVar30->inertia).
                        super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
            if (local_4d0 == (DenseStorage<double,__1,__1,__1,_1> *)0x0) goto LAB_00688e20;
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&local_4d0->m_rows = (int)local_4d0->m_rows + 1;
              UNLOCK();
            }
            else {
              *(int *)&local_4d0->m_rows = (int)local_4d0->m_rows + 1;
            }
            local_4e0 = (ChStateDelta *)((ulong)local_4e0 & 0xffffffff00000000);
LAB_00688e3d:
            pCVar26 = local_4d8;
            ChFrameMoving<double>::GetWvel_loc
                      ((ChFrameMoving<double> *)
                       &(((local_4d8->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar45].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_ChNodeFEAbase).field_0x18);
            ChFrameMoving<double>::GetWacc_loc
                      ((ChFrameMoving<double> *)
                       &(((pCVar26->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar45].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_ChNodeFEAbase).field_0x18);
            peVar12 = (pCVar26->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar45].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = *(double *)&peVar12->field_0xe0;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = *(ulong *)&peVar12->field_0x70;
            auVar62._8_8_ = *(undefined8 *)&peVar12->field_0xd8;
            auVar62._0_8_ = *(undefined8 *)&peVar12->field_0xd8;
            auVar64._8_8_ = *(undefined8 *)&peVar12->field_0xe8;
            auVar64._0_8_ = *(undefined8 *)&peVar12->field_0xe8;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(ulong *)&peVar12->field_0x68;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = *(double *)&peVar12->field_0xe0 * *(double *)&peVar12->field_0x80;
            auVar6 = vfmadd231sd_fma(auVar60,auVar62,auVar7);
            auVar15 = vunpcklpd_avx(auVar65,auVar57);
            auVar5 = vmovhpd_avx(auVar57,*(undefined8 *)&peVar12->field_0x78);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)&peVar12->field_0x98;
            auVar6 = vfmadd231sd_fma(auVar6,auVar64,auVar8);
            auVar58._0_8_ = auVar15._0_8_ * auVar5._0_8_;
            auVar58._8_8_ = auVar15._8_8_ * auVar5._8_8_;
            auVar5 = vfmadd231pd_fma(auVar58,auVar62,*(undefined1 (*) [16])&peVar12->field_0x58);
            local_500._0_16_ =
                 vfmadd231pd_fma(auVar5,auVar64,*(undefined1 (*) [16])&peVar12->field_0x88);
            local_500.m_functor = auVar6._0_8_;
            (*peVar29->_vptr_ChInertiaCosserat[4])(peVar29,local_1a0,&local_418,local_380);
            H = local_488;
            if ((char)local_4e0 == '\0') {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d0);
            }
            local_300._0_8_ =
                 (type)((double)local_320 * (double)local_1a0._0_8_ + (double)local_300._0_8_);
            local_300._8_8_ =
                 (DenseStorage<double,__1,__1,__1,_1> *)
                 ((double)pDStack_318 * (double)local_1a0._8_8_ + (double)local_300._8_8_);
            vStack_2f0.m_value =
                 (long)((double)apDStack_310[0] * (double)local_1a0._16_8_ +
                       (double)vStack_2f0.m_value);
            pMStack_2e8 = (XprTypeNested)
                          ((double)apDStack_310[1] * (double)local_1a0._24_8_ + (double)pMStack_2e8)
            ;
            vStack_2e0.m_value =
                 (long)((double)local_320 * (double)local_180.m_value + (double)vStack_2e0.m_value);
            vStack_2d8.m_value =
                 (long)((double)pDStack_318 * (double)vStack_178.m_value +
                       (double)vStack_2d8.m_value);
            puStack_2d0 = (undefined1 *)
                          ((double)apDStack_310[0] * (double)pCStack_170 + (double)puStack_2d0);
            pStack_2c8.data =
                 (double *)((double)apDStack_310[1] * dStack_168 + (double)pStack_2c8.data);
            local_2c0 = (DenseStorage<double,__1,__1,__1,_1> *)
                        ((double)local_320 * local_160 + (double)local_2c0);
            dStack_2b8 = (double)pDStack_318 * dStack_158 + dStack_2b8;
            dStack_2b0 = (double)apDStack_310[0] * dStack_150 + dStack_2b0;
            dStack_2a8 = (double)apDStack_310[1] * dStack_148 + dStack_2a8;
            dStack_2a0 = (double)local_320 * local_140 + dStack_2a0;
            dStack_298 = (double)pDStack_318 * dStack_138 + dStack_298;
            dStack_290 = (double)apDStack_310[0] * dStack_130 + dStack_290;
            dStack_288 = (double)apDStack_310[1] * dStack_128 + dStack_288;
            local_280 = (double)local_320 * local_120 + local_280;
            dStack_278 = (double)pDStack_318 * dStack_118 + dStack_278;
            dStack_270 = (double)apDStack_310[0] * dStack_110 + dStack_270;
            dStack_268 = (double)apDStack_310[1] * dStack_108 + dStack_268;
            dStack_260 = (double)local_320 * local_100 + dStack_260;
            dStack_258 = (double)pDStack_318 * dStack_f8 + dStack_258;
            dStack_250 = (double)apDStack_310[0] * dStack_f0 + dStack_250;
            dStack_248 = (double)apDStack_310[1] * dStack_e8 + dStack_248;
            local_240 = (double)local_320 * local_e0 + local_240;
            dStack_238 = (double)pDStack_318 * dStack_d8 + dStack_238;
            dStack_230 = (double)apDStack_310[0] * dStack_d0 + dStack_230;
            dStack_228 = (double)apDStack_310[1] * dStack_c8 + dStack_228;
            dStack_220 = (double)local_320 * local_c0 + dStack_220;
            dStack_218 = (double)pDStack_318 * dStack_b8 + dStack_218;
            dStack_210 = (double)apDStack_310[0] * dStack_b0 + dStack_210;
            dStack_208 = (double)apDStack_310[1] * dStack_a8 + dStack_208;
            dStack_200 = (double)local_320 * local_a0 + dStack_200;
            dStack_1f8 = (double)pDStack_318 * dStack_98 + dStack_1f8;
            dStack_1f0 = (double)apDStack_310[0] * dStack_90 + dStack_1f0;
            dStack_1e8 = (double)apDStack_310[1] * dStack_88 + dStack_1e8;
            this = local_4d8;
          }
        }
        lVar54 = uVar45 * 6;
        lVar44 = lVar54 + 6;
        if (((H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value < lVar44) ||
           ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value < lVar44)) {
LAB_00689e95:
          pcVar38 = 
          "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
          ;
          goto LAB_00689e47;
        }
        lVar40 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        pdVar39 = (double *)
                  ((long)(H->
                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         ).
                         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                         .
                         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                         .m_data + (lVar40 + 1) * local_4b1._1_8_ + 0x10);
        lVar47 = 0xb8;
        do {
          dVar17 = *(double *)((long)apDStack_310 + lVar47 + 8);
          pdVar39[-2] = *(double *)((long)apDStack_310 + lVar47) + pdVar39[-2];
          pdVar39[-1] = dVar17 + pdVar39[-1];
          pdVar3 = (double *)(local_300 + lVar47);
          lVar47 = lVar47 + 0x30;
          *pdVar39 = *pdVar3 + *pdVar39;
          pdVar39 = pdVar39 + lVar40;
        } while (lVar47 != 0x148);
        if (((H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value < lVar54 + 3) ||
           ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value < lVar44)) goto LAB_00689e95;
        lVar44 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        pdVar13 = (H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
             (double)local_300;
        local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
             (double)(local_300 + 0x18);
        local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0
        ;
        local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
             1.48219693752374e-323;
        local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
             2.96439387504748e-323;
        local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
             (double)&((this->nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar45].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->field_0x58;
        local_3c8 = 3;
        local_500.m_dstExpr = (DstXprType *)local_380;
        local_500.m_functor = (assign_op<double,_double> *)&local_430;
        local_500.m_src = (SrcEvaluatorType *)&local_418;
        local_500.m_dst = (DstEvaluatorType *)&local_480;
        auVar63 = ZEXT1664(auVar62);
        local_480.m_data = (double *)local_500.m_dstExpr;
        local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
             local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
        local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
             local_418.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        Eigen::internal::
        copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
        ::run(&local_500);
        auVar62 = auVar63._0_16_;
        pdVar39 = pdVar13 + lVar54 + 3 + lVar54 * lVar44;
        lVar44 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        local_4b1._1_8_ = local_4b1._1_8_ + 0x30;
        uVar45 = uVar45 + 1;
        *pdVar39 = (double)local_380._0_8_ + *pdVar39;
        pdVar39[1] = (double)local_380._24_8_ + pdVar39[1];
        pdVar39[2] = (double)local_380._48_8_ + pdVar39[2];
        pdVar39[lVar44] = (double)local_380._8_8_ + pdVar39[lVar44];
        pdVar39[lVar44 + 1] = (double)local_380._32_8_ + pdVar39[lVar44 + 1];
        pdVar39[lVar44 + 2] = (double)local_380._56_8_ + pdVar39[lVar44 + 2];
        pdVar39[lVar44 * 2] = (double)local_380._16_8_ + pdVar39[lVar44 * 2];
        pdVar39[lVar44 * 2 + 1] = (double)local_380._40_8_ + pdVar39[lVar44 * 2 + 1];
        pdVar39[lVar44 * 2 + 2] = (double)local_380._64_8_ + pdVar39[lVar44 * 2 + 2];
      } while (uVar45 < (ulong)((long)(this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    goto LAB_0068924f;
  }
  pcVar38 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
  ;
LAB_00689ef7:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar38);
LAB_00689eac:
  pcVar38 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_00689ef7;
LAB_00689ee2:
  pcVar38 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_00689ef7;
LAB_00689f6a:
  pcVar38 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
  ;
  goto LAB_00689f7f;
LAB_00689f04:
  pcVar38 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
  ;
  goto LAB_00689f19;
LAB_00689f48:
  pcVar38 = 
  "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
  ;
LAB_00689f5d:
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,pcVar38);
}

Assistant:

void ChElementBeamIGA::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 6 * nodes.size()) && (H.cols() == 6 * nodes.size()));
    assert(section);

    // BRUTE FORCE METHOD: USE NUMERICAL DIFFERENTIATION!

    //
    // The K stiffness matrix of this element span:
    //

    ChState state_x(this->LoadableGet_ndof_x(), nullptr);
    ChStateDelta state_w(this->LoadableGet_ndof_w(), nullptr);
    this->LoadableGetStateBlock_x(0, state_x);
    this->LoadableGetStateBlock_w(0, state_w);

    int mrows_w = this->LoadableGet_ndof_w();
    int mrows_x = this->LoadableGet_ndof_x();

    // compute Q at current speed & position, x_0, v_0
    ChVectorDynamic<> Q0(mrows_w);
    this->ComputeInternalForces_impl(Q0, state_x, state_w, true);  // Q0 = Q(x, v)

    ChVectorDynamic<> Q1(mrows_w);
    ChVectorDynamic<> Jcolumn(mrows_w);

    if (Kfactor) {
        ChMatrixDynamic<> K(mrows_w, mrows_w);

        ChState state_x_inc(mrows_x, nullptr);
        ChStateDelta state_delta(mrows_w, nullptr);

        // Compute K=-dQ(x,v)/dx by backward differentiation
        state_delta.setZero(mrows_w, nullptr);

        for (int i = 0; i < mrows_w; ++i) {
            state_delta(i) += Delta;
            this->LoadableStateIncrement(0, state_x_inc, state_x, 0,
                                         state_delta);  // exponential, usually state_x_inc(i) = state_x(i) + Delta;

            Q1.setZero(mrows_w);
            this->ComputeInternalForces_impl(Q1, state_x_inc, state_w, true);  // Q1 = Q(x+Dx, v)
            state_delta(i) -= Delta;

            Jcolumn = (Q1 - Q0) * (-1.0 / Delta);  // - sign because K=-dQ/dx
            K.col(i) = Jcolumn;
        }

        // finally, store K into H:
        H.block(0, 0, mrows_w, mrows_w) = Kfactor * K;
    } else
        H.setZero();

    //
    // The R damping matrix of this element:
    //

    if (Rfactor && this->section->GetDamping()) {
        // Compute R=-dQ(x,v)/dv by backward differentiation
        ChStateDelta state_w_inc(mrows_w, nullptr);
        state_w_inc = state_w;
        ChMatrixDynamic<> R(mrows_w, mrows_w);

        for (int i = 0; i < mrows_w; ++i) {
            Q1.setZero(mrows_w);

            state_w_inc(i) += Delta;
            this->ComputeInternalForces_impl(Q1, state_x, state_w_inc, true);  // Q1 = Q(x, v+Dv)
            state_w_inc(i) -= Delta;

            Jcolumn = (Q1 - Q0) * (-1.0 / Delta);  // - sign because R=-dQ/dv
            R.col(i) = Jcolumn;
        }
        H.block(0, 0, mrows_w, mrows_w) += Rfactor * R;
    }

    // Add inertial stiffness matrix and inertial damping matrix (gyroscopic damping),
    // if enabled in section material.
    // These matrices are not symmetric.
    // A lumped version of the inertial damping/stiffness matrix computation is used here,
    // on a per-node basis. In future one could implement also a consistent version of it, optionally, depending on
    // ChElementBeamIGA::lumped_mass.
    if ((Rfactor && this->section->GetInertia()->compute_inertia_damping_matrix) ||
        (Kfactor && this->section->GetInertia()->compute_inertia_stiffness_matrix)) {
        ChMatrixNM<double, 6, 6> matr_loc;
        ChMatrixNM<double, 6, 6> KRi_loc;
        KRi_loc.setZero();

        double node_multiplier_fact_R = 0.5 * length * Rfactor;
        double node_multiplier_fact_K = 0.5 * length * Kfactor;
        for (int i = 0; i < nodes.size(); ++i) {
            int stride = i * 6;
            if (this->section->GetInertia()->compute_inertia_damping_matrix) {
                this->section->GetInertia()->ComputeInertiaDampingMatrix(matr_loc, nodes[i]->GetWvel_loc());
                KRi_loc += matr_loc * node_multiplier_fact_R;
            }
            if (this->section->GetInertia()->compute_inertia_stiffness_matrix) {
                this->section->GetInertia()->ComputeInertiaStiffnessMatrix(
                    matr_loc, nodes[i]->GetWvel_loc(), nodes[i]->GetWacc_loc(),
                    (nodes[i]->GetA().transpose()) * nodes[i]->GetPos_dtdt());  // assume x_dtdt in local frame!
                KRi_loc += matr_loc * node_multiplier_fact_K;
            }
            // corotate the local damping and stiffness matrices (at once, already scaled) into absolute one
            // H.block<3, 3>(stride,   stride  ) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0,0) *
            // (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(0,0) is null by construction
            H.block<3, 3>(stride + 3, stride + 3) += KRi_loc.block<3, 3>(3, 3);
            H.block<3, 3>(stride, stride + 3) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0, 3);
            // H.block<3, 3>(stride+3, stride)   +=                    KRi_loc.block<3, 3>(3,0) *
            // (nodes[i]->GetA().transpose());  // NOTE: not needed as KRi_loc.block<3, 3>(3,0) is null by construction
        }
    }

    //
    // The M mass matrix of this element span:
    //

    if (Mfactor) {
        ChMatrixDynamic<> Mloc(6 * nodes.size(), 6 * nodes.size());
        Mloc.setZero();
        ChMatrix33<> Mxw;

        if (ChElementBeamIGA::lumped_mass == true) {
            //
            // "lumped" M mass matrix
            //
            ChMatrixNM<double, 6, 6> sectional_mass;
            this->section->GetInertia()->ComputeInertiaMatrix(sectional_mass);

            double node_multiplier = length / (double)nodes.size();
            for (int i = 0; i < nodes.size(); ++i) {
                int stride = i * 6;
                // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
                // hence it can be the simple (constant) expression
                //   Mloc.block<6, 6>(stride, stride) += sectional_mass * (node_multiplier * Mfactor);
                // but the more general case needs the rotations, hence:
                Mloc.block<3, 3>(stride, stride) += sectional_mass.block<3, 3>(0, 0) * (node_multiplier * Mfactor);
                Mloc.block<3, 3>(stride + 3, stride + 3) +=
                    sectional_mass.block<3, 3>(3, 3) * (node_multiplier * Mfactor);
                Mxw = nodes[i]->GetA() * sectional_mass.block<3, 3>(0, 3) * (node_multiplier * Mfactor);
                Mloc.block<3, 3>(stride, stride + 3) += Mxw;
                Mloc.block<3, 3>(stride + 3, stride) += Mxw.transpose();
            }
        } else {
            //
            // "consistent" M mass matrix, via Gauss quadrature
            //
            ChMatrixNM<double, 6, 6> sectional_mass;
            this->section->GetInertia()->ComputeInertiaMatrix(sectional_mass);

            double u1 = knots(order);
            double u2 = knots(knots.size() - order - 1);

            double c1 = (u2 - u1) / 2;
            double c2 = (u2 + u1) / 2;

            // Do quadrature over the Gauss points - reuse the "b" bend Gauss points

            for (int ig = 0; ig < int_order_b; ++ig) {
                // absyssa in typical -1,+1 range:
                double eta = ChQuadrature::GetStaticTables()->Lroots[int_order_b - 1][ig];
                // absyssa in span range:
                double u = (c1 * eta + c2);
                // scaling = gauss weight
                double w = ChQuadrature::GetStaticTables()->Weight[int_order_b - 1][ig];

                // Jacobian Jsu = ds/du
                double Jsu = this->Jacobian_b[ig];
                // Jacobian Jue = du/deta
                double Jue = c1;

                // compute the basis functions N(u) at given u:
                int nspan = order;

                ChVectorDynamic<> N((int)nodes.size());
                geometry::ChBasisToolsBspline::BasisEvaluate(this->order, nspan, u, knots, N);

                /*
                // interpolate rotation of section at given u, to compute R.
                ChQuaternion<> q_delta;
                ChVector<> da = VNULL;
                ChVector<> delta_rot_dir;
                double delta_rot_angle;
                for (int i = 0; i < nodes.size(); ++i) {
                    ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                    q_delta = nodes[0]->coord.rot.GetConjugate() * q_i;
                    q_delta.Q_to_AngAxis(delta_rot_angle, delta_rot_dir); // a_i = dir_i*angle_i (in spline local
                reference, -PI..+PI) da += delta_rot_dir * delta_rot_angle * N(i);  // a = N_i*a_i
                }
                ChQuaternion<> qda; qda.Q_from_Rotv(da);
                ChQuaternion<> qR = nodes[0]->coord.rot * qda;

                // compute the 3x3 rotation matrix R equivalent to quaternion above
                ChMatrix33<> R(qR);
                */

                // A simplification, for moderate bending, ignore the difference between beam section R
                // and R_i of nearby nodes, obtaining:

                for (int i = 0; i < nodes.size(); ++i) {
                    for (int j = 0; j < nodes.size(); ++j) {
                        int istride = i * 6;
                        int jstride = j * 6;

                        double Ni_Nj = N(i) * N(j);
                        double gmassfactor = Mfactor * w * Jsu * Jue * Ni_Nj;

                        // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
                        // hence it can be the simple (constant) expression
                        //   Mloc.block<6, 6>(istride + 0, jstride + 0) += gmassfactor * sectional_mass;
                        // but the more general case needs the rotations, hence:
                        Mloc.block<3, 3>(istride, jstride) += sectional_mass.block<3, 3>(0, 0) * gmassfactor;
                        Mloc.block<3, 3>(istride + 3, jstride + 3) += sectional_mass.block<3, 3>(3, 3) * gmassfactor;
                        Mxw = nodes[i]->GetA() * sectional_mass.block<3, 3>(0, 3) * gmassfactor;
                        Mloc.block<3, 3>(istride, jstride + 3) += Mxw;
                        Mloc.block<3, 3>(istride + 3, jstride) += Mxw.transpose();
                    }
                }

            }  // end loop on gauss points
        }

        H.block(0, 0, Mloc.rows(), Mloc.cols()) += Mloc;
    }
}